

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall CVerifyDB::~CVerifyDB(CVerifyDB *this)

{
  long *plVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  bilingual_str *in_stack_ffffffffffffff98;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = (long *)(in_RDI->_M_dataplus)._M_p;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI);
  (**(code **)(*plVar1 + 0x20))(plVar1,local_48,100,0);
  bilingual_str::~bilingual_str(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CVerifyDB::~CVerifyDB()
{
    m_notifications.progress(bilingual_str{}, 100, false);
}